

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  initializer_list<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  __l;
  thread th_meteo;
  topic_ptr_t<std::__cxx11::basic_string<char>_*> meteo_b;
  topic_ptr_t<std::__cxx11::basic_string<char>_*> meteo_a;
  shared_ptr<publisher_t> meteo_station;
  shared_ptr<publisher_t> meteo_b_station;
  shared_ptr<publisher_t> meteo_a_station;
  global_sub global;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffc9c1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffc9c1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffc9c1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffc9c210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffc9c230;
  
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffc9c278,"meteo-a","");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ps::Topic<std::__cxx11::string*>,std::allocator<ps::Topic<std::__cxx11::string*>>,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c1c0,
             (Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              **)&stack0xffffffffffc9c1b8,
             (allocator<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)&stack0xffffffffffc9c1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffc9c278);
  if (in_stack_ffffffffffc9c1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count + 1;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<publisher_t,std::allocator<publisher_t>,std::shared_ptr<ps::Topic<std::__cxx11::string*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c230,
             (publisher_t **)&stack0xffffffffffc9c228,
             (allocator<publisher_t> *)&stack0xffffffffffc9c278,
             (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)&stack0xffffffffffc9c218);
  if (in_stack_ffffffffffc9c1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffc9c1c0._M_pi);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffc9c258,"A","");
  std::__cxx11::string::operator=((string *)0xb0,(string *)&stack0xffffffffffc9c258);
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffc9c278,"meteo-b","");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ps::Topic<std::__cxx11::string*>,std::allocator<ps::Topic<std::__cxx11::string*>>,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c1b0,
             (Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              **)&stack0xffffffffffc9c1a8,
             (allocator<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)&stack0xffffffffffc9c1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffc9c278);
  if (in_stack_ffffffffffc9c1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count + 1;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<publisher_t,std::allocator<publisher_t>,std::shared_ptr<ps::Topic<std::__cxx11::string*>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c210,
             (publisher_t **)&stack0xffffffffffc9c208,
             (allocator<publisher_t> *)&stack0xffffffffffc9c278,
             (shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)&stack0xffffffffffc9c1f8);
  if (in_stack_ffffffffffc9c1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffc9c1b0._M_pi);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffc9c238,"B","");
  std::__cxx11::string::operator=((string *)0xb0,(string *)&stack0xffffffffffc9c238);
  if (in_stack_ffffffffffc9c1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count + 1;
    }
  }
  if (in_stack_ffffffffffc9c1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)&stack0xffffffffffc9c278;
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::vector((vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
            *)&stack0xffffffffffc9c1c8,__l,(allocator_type *)&stack0xffffffffffc9c19f);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<publisher_t,std::allocator<publisher_t>,std::vector<std::shared_ptr<ps::Topic<std::__cxx11::string*>>,std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::string*>>>>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffc9c1f0,
             (publisher_t **)&stack0xffffffffffc9c1e8,
             (allocator<publisher_t> *)&stack0xffffffffffc9c1a0,
             (vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
              *)&stack0xffffffffffc9c1c8);
  std::
  vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
  ::~vector((vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
             *)&stack0xffffffffffc9c1c8);
  lVar3 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(&stack0xffffffffffc9c270 + lVar3) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  (&stack0xffffffffffc9c270 + lVar3));
    }
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0);
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::Subscriber((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *)&stack0xffffffffffc9c278);
  if (in_stack_ffffffffffc9c1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1c0._M_pi)->_M_use_count + 1;
    }
  }
  if (in_stack_ffffffffffc9c1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1b0._M_pi)->_M_use_count + 1;
    }
  }
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::subscribe((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               *)&stack0xffffffffffc9c278,
              (topic_ptr_t<std::__cxx11::basic_string<char>_*> *)&stack0xffffffffffc9c1c8);
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::subscribe((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               *)&stack0xffffffffffc9c278,
              (topic_ptr_t<std::__cxx11::basic_string<char>_*> *)&stack0xffffffffffc9c1d8);
  lVar3 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(&stack0xffffffffffc9c1c0 + lVar3) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  (&stack0xffffffffffc9c1c0 + lVar3));
    }
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0);
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::run((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
         *)&stack0xffffffffffc9c278);
  if (in_stack_ffffffffffc9c1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (in_stack_ffffffffffc9c1f0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (in_stack_ffffffffffc9c1f0._M_pi)->_M_use_count =
           (in_stack_ffffffffffc9c1f0._M_pi)->_M_use_count + 1;
    }
  }
  plVar1 = (long *)operator_new(0x18);
  *plVar1 = (long)&PTR___State_impl_0010ad78;
  plVar1[1] = 0;
  plVar1[2] = (long)in_stack_ffffffffffc9c1f0._M_pi;
  std::thread::_M_start_thread(&stack0xffffffffffc9c1a0,&stack0xffffffffffc9c1c8,0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  std::thread::join();
  ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  ::stop_wait((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               *)&stack0xffffffffffc9c278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"g_counter: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  global_sub::~global_sub((global_sub *)&stack0xffffffffffc9c278);
  if (in_stack_ffffffffffc9c1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffc9c1f0._M_pi);
  }
  if (in_stack_ffffffffffc9c210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffc9c210._M_pi);
  }
  if (in_stack_ffffffffffc9c1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffc9c1b0._M_pi);
  }
  if (in_stack_ffffffffffc9c230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffc9c230._M_pi);
  }
  if (in_stack_ffffffffffc9c1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_ffffffffffc9c1c0._M_pi);
  }
  return 0;
}

Assistant:

int main()
{
	auto meteo_a = create_topic<std::string*>("meteo-a");
	auto meteo_a_station = create_publisher<std::string*, publisher_t>(meteo_a);
	meteo_a_station->set_name("A");

	auto meteo_b = create_topic<std::string*>("meteo-b");
	auto meteo_b_station = create_publisher<std::string*, publisher_t>(meteo_b);
	meteo_b_station->set_name("B");

	auto meteo_station = create_publisher<std::string*, publisher_t>(std::vector<topic_ptr_t<std::string*>>{meteo_a, meteo_b});

	global_sub global;
	global.subscribe({meteo_a, meteo_b});

	global.counter = 0;
	global.run();

	std::thread th_meteo([=]{
		std::vector<std::string> cities{"Rome", "Florence", "Venice"};

		for (uint32_t i = 0; i < 1000000; i++)
		{
			const std::string tcelsius_a = std::to_string(24 + (i % 10));
			//const std::string tcelsius_b = std::to_string(34 + (i % 19));
			meteo_station->produce(push_data(cities[i%3] + ", " + tcelsius_a));
			//meteo_b_station->produce(push_data(cities[i%3] + ", " + tcelsius_b));
		}
	});

	th_meteo.join();
	global.stop_wait();

	std::cout << "g_counter: " << global.counter << std::endl;

	return 0;
}